

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

u32string * __thiscall
unicpp::string::utf32_str_abi_cxx11_(u32string *__return_storage_ptr__,string *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  begin._M_current = (this->m_content)._M_dataplus._M_p;
  utf8_to_utf32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(begin._M_current + (this->m_content)._M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::u32string string::utf32_str() const
{
    std::u32string result;
    utf8_to_utf32(m_content.begin(), m_content.end(), std::back_inserter(result));

    return result;
}